

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_38f65::P::P(P *this)

{
  element_type *tracer;
  shared_ptr<ccs::CcsLogger> local_20;
  P *local_10;
  P *this_local;
  
  local_10 = this;
  ::ccs::CcsLogger::makeStdErrLogger();
  ::ccs::CcsTracer::makeLoggingTracer((CcsTracer *)this,&local_20,false);
  std::shared_ptr<ccs::CcsLogger>::~shared_ptr(&local_20);
  tracer = std::__shared_ptr_access<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this);
  ::ccs::Parser::Parser(&this->parser,tracer);
  return;
}

Assistant:

P() :
    trace(CcsTracer::makeLoggingTracer(CcsLogger::makeStdErrLogger())),
    parser(*trace) {}